

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreUniformLimitsTest::doesProgramLink
          (ImageLoadStoreUniformLimitsTest *this,char *fragment_shader_code,
          char *geometry_shader_code,char *tesselation_control_shader_code,
          char *tesselation_evaluation_shader_code,char *vertex_shader_code)

{
  GLuint program;
  bool local_39;
  GLuint program_id;
  bool is_program_built;
  char *vertex_shader_code_local;
  char *tesselation_evaluation_shader_code_local;
  char *tesselation_control_shader_code_local;
  char *geometry_shader_code_local;
  char *fragment_shader_code_local;
  ImageLoadStoreUniformLimitsTest *this_local;
  
  local_39 = true;
  _program_id = vertex_shader_code;
  vertex_shader_code_local = tesselation_evaluation_shader_code;
  tesselation_evaluation_shader_code_local = tesselation_control_shader_code;
  tesselation_control_shader_code_local = geometry_shader_code;
  geometry_shader_code_local = fragment_shader_code;
  fragment_shader_code_local = (char *)this;
  program = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,vertex_shader_code,
                       tesselation_control_shader_code,tesselation_evaluation_shader_code,
                       geometry_shader_code,fragment_shader_code,&local_39);
  if (program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,program);
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool doesProgramLink(const char* fragment_shader_code, const char* geometry_shader_code,
						 const char* tesselation_control_shader_code, const char* tesselation_evaluation_shader_code,
						 const char* vertex_shader_code)
	{
		bool   is_program_built = true;
		GLuint program_id		= 0;

		program_id =
			BuildProgram(vertex_shader_code, tesselation_control_shader_code, tesselation_evaluation_shader_code,
						 geometry_shader_code, fragment_shader_code, &is_program_built);

		if (0 != program_id)
		{
			glDeleteProgram(program_id);
		}

		return is_program_built;
	}